

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::unroll_array_from_complex_load
          (CompilerGLSL *this,uint32_t target_id,uint32_t source_id,string *expr)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRVariable *var_00;
  SPIRType *pSVar4;
  bool *pbVar5;
  uint *puVar6;
  CompilerError *this_00;
  bool local_122;
  undefined1 local_118 [40];
  string local_f0 [32];
  spirv_cross local_d0 [32];
  string local_b0 [8];
  string array_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  spirv_cross local_60 [8];
  string new_expr;
  bool is_patch;
  bool is_tess;
  bool is_builtin;
  BuiltIn builtin;
  SPIRType *type;
  SPIRVariable *var;
  string *expr_local;
  uint32_t source_id_local;
  uint32_t target_id_local;
  CompilerGLSL *this_local;
  
  if (((((this->backend).force_gl_in_out_block & 1U) != 0) &&
      (expr_local._0_4_ = source_id, expr_local._4_4_ = target_id, _source_id_local = this,
      var_00 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,source_id),
      var_00 != (SPIRVariable *)0x0)) && (var_00->storage == StorageClassInput)) {
    pSVar4 = Compiler::get_variable_data_type(&this->super_Compiler,var_00);
    bVar1 = VectorView<unsigned_int>::empty(&(pSVar4->array).super_VectorView<unsigned_int>);
    if (!bVar1) {
      uVar3 = Compiler::get_decoration
                        (&this->super_Compiler,(ID)(var_00->super_IVariant).self.id,
                         DecorationBuiltIn);
      bVar1 = Compiler::is_builtin_variable(&this->super_Compiler,var_00);
      local_122 = false;
      if (bVar1) {
        local_122 = uVar3 < 2;
      }
      bVar1 = Compiler::is_tessellation_shader(&this->super_Compiler);
      bVar2 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)(var_00->super_IVariant).self.id,DecorationPatch)
      ;
      if ((!bVar2) && ((local_122 || (bVar1)))) {
        join<char_const(&)[2],unsigned_int&,char_const(&)[10]>
                  (local_60,(char (*) [2])0x4e3b4c,(uint *)((long)&expr_local + 4),
                   (char (*) [10])"_unrolled");
        (*(this->super_Compiler)._vptr_Compiler[0x1a])
                  (local_80,this,pSVar4,local_60,(ulong)expr_local._4_4_);
        statement<std::__cxx11::string,char_const(&)[2]>(this,local_80,(char (*) [2])0x4d9ce2);
        ::std::__cxx11::string::~string((string *)local_80);
        ::std::__cxx11::string::string(local_b0);
        pbVar5 = VectorView<bool>::back(&(pSVar4->array_size_literal).super_VectorView<bool>);
        if ((*pbVar5 & 1U) == 0) {
          puVar6 = VectorView<unsigned_int>::back(&(pSVar4->array).super_VectorView<unsigned_int>);
          to_expression_abi_cxx11_((CompilerGLSL *)local_118,(uint32_t)this,SUB41(*puVar6,0));
          ::std::__cxx11::string::operator=(local_b0,(string *)local_118);
          ::std::__cxx11::string::~string((string *)local_118);
        }
        else {
          puVar6 = VectorView<unsigned_int>::back(&(pSVar4->array).super_VectorView<unsigned_int>);
          convert_to_string<unsigned_int,_0>(local_d0,puVar6);
          ::std::__cxx11::string::operator=(local_b0,(string *)local_d0);
          ::std::__cxx11::string::~string((string *)local_d0);
          puVar6 = VectorView<unsigned_int>::back(&(pSVar4->array).super_VectorView<unsigned_int>);
          if (*puVar6 == 0) {
            local_118[0x26] = 1;
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_f0,"Cannot unroll an array copy from unsized array.",
                       (allocator *)(local_118 + 0x27));
            CompilerError::CompilerError(this_00,(string *)local_f0);
            local_118[0x26] = 0;
            __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
        }
        statement<char_const(&)[25],std::__cxx11::string&,char_const(&)[8]>
                  (this,(char (*) [25])"for (int i = 0; i < int(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   (char (*) [8])"); i++)");
        begin_scope(this);
        if (local_122) {
          statement<std::__cxx11::string&,char_const(&)[16],std::__cxx11::string&,char_const(&)[2]>
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,(char (*) [16])"[i] = gl_in[i].",expr,(char (*) [2])0x4d9ce2);
        }
        else {
          statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[5]>
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,(char (*) [7])"[i] = ",expr,(char (*) [5])0x4ea112);
        }
        end_scope(this);
        ::std::__cxx11::string::operator=((string *)expr,(string *)local_60);
        ::std::__cxx11::string::~string(local_b0);
        ::std::__cxx11::string::~string((string *)local_60);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::unroll_array_from_complex_load(uint32_t target_id, uint32_t source_id, std::string &expr)
{
	if (!backend.force_gl_in_out_block)
		return;
	// This path is only relevant for GL backends.

	auto *var = maybe_get<SPIRVariable>(source_id);
	if (!var)
		return;

	if (var->storage != StorageClassInput)
		return;

	auto &type = get_variable_data_type(*var);
	if (type.array.empty())
		return;

	auto builtin = BuiltIn(get_decoration(var->self, DecorationBuiltIn));
	bool is_builtin = is_builtin_variable(*var) && (builtin == BuiltInPointSize || builtin == BuiltInPosition);
	bool is_tess = is_tessellation_shader();
	bool is_patch = has_decoration(var->self, DecorationPatch);

	// Tessellation input arrays are special in that they are unsized, so we cannot directly copy from it.
	// We must unroll the array load.
	// For builtins, we couldn't catch this case normally,
	// because this is resolved in the OpAccessChain in most cases.
	// If we load the entire array, we have no choice but to unroll here.
	if (!is_patch && (is_builtin || is_tess))
	{
		auto new_expr = join("_", target_id, "_unrolled");
		statement(variable_decl(type, new_expr, target_id), ";");
		string array_expr;
		if (type.array_size_literal.back())
		{
			array_expr = convert_to_string(type.array.back());
			if (type.array.back() == 0)
				SPIRV_CROSS_THROW("Cannot unroll an array copy from unsized array.");
		}
		else
			array_expr = to_expression(type.array.back());

		// The array size might be a specialization constant, so use a for-loop instead.
		statement("for (int i = 0; i < int(", array_expr, "); i++)");
		begin_scope();
		if (is_builtin)
			statement(new_expr, "[i] = gl_in[i].", expr, ";");
		else
			statement(new_expr, "[i] = ", expr, "[i];");
		end_scope();

		expr = move(new_expr);
	}
}